

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImGuiTableCellData *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *pIVar6;
  ImGuiTableColumn *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ImVec2 IVar33;
  ImVec2 IVar34;
  bool bVar35;
  ImGuiContext *pIVar36;
  ImS8 *pIVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  ImGuiTableCellData *pIVar42;
  int iVar43;
  ImU32 col;
  ImU32 col_00;
  uint uVar44;
  uint uVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar57;
  int iVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long lVar58;
  float fVar60;
  float fVar61;
  float fVar65;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar69;
  ulong uVar67;
  undefined1 auVar68 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar87;
  undefined1 auVar85 [16];
  int iVar88;
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar102;
  int iVar106;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ImRect row_rect;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImU32 local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [16];
  long lVar66;
  
  pIVar36 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar36->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar60 = table->RowPosY2;
  auVar62 = ZEXT416((uint)fVar60);
  (pIVar5->DC).CursorPos.y = fVar60;
  fVar65 = table->RowPosY1;
  auVar47 = ZEXT416((uint)fVar65);
  if (table->CurrentRow == 0) {
    table->LastFirstRowHeight = fVar60 - fVar65;
  }
  iVar39 = table->CurrentRow + 1;
  iVar41 = (int)table->FreezeRowsCount;
  iVar43 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar60) && (fVar65 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_74 = iVar43;
    local_68 = auVar47;
    local_48 = auVar62;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      fVar65 = (float)local_68._0_4_;
    }
    col = table->RowBgColor[1];
    local_78 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       (local_78 = 0, (table->Flags & 0x80) != 0)) {
      local_78 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar4 = table->RowCellDataCurrent;
    local_70 = iVar41;
    local_6c = iVar39;
    if ((-1 < cVar4 || iVar39 == iVar41) || (local_78 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar60 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar65 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar70 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar6 = pIVar5->DrawList;
        (pIVar6->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar6->_CmdHeader).ClipRect.y = fVar60;
        (pIVar6->_CmdHeader).ClipRect.z = fVar65;
        (pIVar6->_CmdHeader).ClipRect.w = fVar70;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar5->DrawList,0);
      fVar65 = (float)local_68._0_4_;
    }
    if (col != 0 || col_00 != 0) {
      fVar60 = (table->WorkRect).Min.x;
      fVar70 = (table->WorkRect).Max.x;
      IVar3 = (table->BgClipRect).Min;
      fVar61 = IVar3.x;
      fVar69 = IVar3.y;
      uVar44 = -(uint)(fVar61 <= fVar60);
      uVar45 = -(uint)(fVar69 <= fVar65);
      local_88 = (ImVec2)(CONCAT44(~uVar45 & (uint)fVar69,~uVar44 & (uint)fVar61) |
                         CONCAT44((uint)fVar65 & uVar45,(uint)fVar60 & uVar44));
      auVar62._8_8_ = 0;
      auVar62._0_4_ = (table->BgClipRect).Max.x;
      auVar62._4_4_ = (table->BgClipRect).Max.y;
      auVar85._4_8_ = 0;
      auVar85._0_4_ = fVar70;
      auVar85._12_4_ = local_48._4_4_;
      auVar47._8_8_ = auVar85._8_8_;
      auVar47._4_4_ = local_48._0_4_;
      auVar47._0_4_ = fVar70;
      auVar62 = minps(auVar47,auVar62);
      IStack_80 = auVar62._0_8_;
      if ((col_00 != 0) && (IStack_80.y = auVar62._4_4_, bVar35 = local_88.y < IStack_80.y, bVar35))
      {
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_88,&IStack_80,col_00,0.0,0);
      }
      if ((col != 0) && (local_88.y < IStack_80.y)) {
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_88,&IStack_80,col,0.0,0);
      }
    }
    if ((-1 < cVar4) && (-1 < (long)table->RowCellDataCurrent)) {
      pIVar42 = (table->RowCellData).Data;
      pIVar1 = pIVar42 + table->RowCellDataCurrent;
      do {
        pIVar7 = (table->Columns).Data;
        fVar60 = (table->WorkRect).Min.x;
        uVar44 = -(uint)(fVar60 <= pIVar7[pIVar42->Column].MinX);
        fVar70 = (float)(~uVar44 & (uint)fVar60 | (uint)pIVar7[pIVar42->Column].MinX & uVar44);
        fVar60 = (table->WorkRect).Max.x;
        fVar65 = pIVar7[pIVar42->Column].MaxX;
        if (fVar60 <= pIVar7[pIVar42->Column].MaxX) {
          fVar65 = fVar60;
        }
        auVar89._4_4_ = table->RowPosY2;
        auVar89._0_4_ = fVar65;
        auVar89._8_8_ = 0;
        IVar3 = (table->BgClipRect).Min;
        fVar60 = IVar3.x;
        fVar65 = IVar3.y;
        uVar44 = -(uint)(fVar60 <= fVar70);
        uVar45 = -(uint)(fVar65 <= table->RowPosY1);
        uVar67 = CONCAT44(~uVar45 & (uint)fVar65,~uVar44 & (uint)fVar60) |
                 CONCAT44((uint)table->RowPosY1 & uVar45,(uint)fVar70 & uVar44);
        auVar63._8_8_ = 0;
        auVar63._0_4_ = (table->BgClipRect).Max.x;
        auVar63._4_4_ = (table->BgClipRect).Max.y;
        auVar62 = minps(auVar89,auVar63);
        local_88.x = (float)uVar67;
        fVar60 = pIVar7[pIVar42->Column].ClipRect.Min.x;
        uVar44 = -(uint)(fVar60 <= local_88.x);
        local_88.y = (float)(uVar67 >> 0x20);
        local_88.x = (float)(uVar44 & (uint)local_88.x | ~uVar44 & (uint)fVar60);
        IStack_80.x = auVar62._0_4_;
        if (pIVar7[pIVar42->Column].MaxX <= IStack_80.x) {
          IStack_80.x = pIVar7[pIVar42->Column].MaxX;
        }
        IStack_80.y = auVar62._4_4_;
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_88,&IStack_80,pIVar42->BgColor,0.0,0);
        pIVar42 = pIVar42 + 1;
      } while (pIVar42 <= pIVar1);
    }
    if (((local_78 != 0) && ((table->BgClipRect).Min.y <= (float)local_68._0_4_)) &&
       ((float)local_68._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.y = (float)local_68._0_4_;
      local_88.x = table->BorderX1;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_68._0_4_;
      ImDrawList::AddLine(pIVar5->DrawList,&local_88,&local_50,local_78,1.0);
    }
    iVar39 = local_6c;
    iVar41 = local_70;
    iVar43 = local_74;
    if (((local_6c == local_70) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_88.y = (float)local_48._0_4_;
      local_88.x = table->BorderX1;
      local_50.x = table->BorderX2;
      local_50.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar5->DrawList,&local_88,&local_50,table->BorderColorStrong,1.0);
    }
  }
  auVar62 = _DAT_0017b310;
  if (iVar39 == iVar43) {
    iVar43 = table->ColumnsCount;
    if (0 < (long)iVar43) {
      lVar38 = (long)table->FreezeColumnsCount;
      lVar40 = (long)iVar43 + -1;
      local_68._8_4_ = (int)lVar40;
      local_68._0_8_ = lVar40;
      local_68._12_4_ = (int)((ulong)lVar40 >> 0x20);
      pIVar37 = &((table->Columns).Data)->NavLayerCurrent;
      lVar40 = 0xf;
      auVar47 = local_68;
      auVar64 = _DAT_00185230;
      auVar68 = _DAT_00185240;
      auVar71 = _DAT_00185250;
      auVar72 = _DAT_00185260;
      auVar73 = _DAT_00185270;
      auVar74 = _DAT_00185280;
      auVar75 = _DAT_00185290;
      auVar76 = _DAT_0017e7d0;
      do {
        auVar85 = local_68 ^ auVar62;
        auVar89 = auVar76 ^ auVar62;
        iVar57 = auVar85._0_4_;
        iVar102 = -(uint)(iVar57 < auVar89._0_4_);
        iVar59 = auVar85._4_4_;
        auVar91._4_4_ = -(uint)(iVar59 < auVar89._4_4_);
        iVar87 = auVar85._8_4_;
        iVar106 = -(uint)(iVar87 < auVar89._8_4_);
        iVar88 = auVar85._12_4_;
        auVar91._12_4_ = -(uint)(iVar88 < auVar89._12_4_);
        auVar18._4_4_ = iVar102;
        auVar18._0_4_ = iVar102;
        auVar18._8_4_ = iVar106;
        auVar18._12_4_ = iVar106;
        auVar47 = pshuflw(auVar47,auVar18,0xe8);
        auVar90._4_4_ = -(uint)(auVar89._4_4_ == iVar59);
        auVar90._12_4_ = -(uint)(auVar89._12_4_ == iVar88);
        auVar90._0_4_ = auVar90._4_4_;
        auVar90._8_4_ = auVar90._12_4_;
        auVar89 = pshuflw(in_XMM11,auVar90,0xe8);
        auVar91._0_4_ = auVar91._4_4_;
        auVar91._8_4_ = auVar91._12_4_;
        auVar85 = pshuflw(auVar47,auVar91,0xe8);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar85 | auVar89 & auVar47) ^ auVar48;
        auVar47 = packssdw(auVar48,auVar48);
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pIVar37 = lVar40 + -0xf < lVar38;
        }
        auVar19._4_4_ = iVar102;
        auVar19._0_4_ = iVar102;
        auVar19._8_4_ = iVar106;
        auVar19._12_4_ = iVar106;
        auVar91 = auVar90 & auVar19 | auVar91;
        auVar47 = packssdw(auVar91,auVar91);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar8,auVar47 ^ auVar8);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._0_4_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x68) = lVar40 + -0xe < lVar38;
        }
        auVar47 = auVar75 ^ auVar62;
        auVar77._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar77._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar77._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar77._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar92._4_4_ = auVar77._0_4_;
        auVar92._0_4_ = auVar77._0_4_;
        auVar92._8_4_ = auVar77._8_4_;
        auVar92._12_4_ = auVar77._8_4_;
        iVar102 = -(uint)(auVar47._4_4_ == iVar59);
        iVar106 = -(uint)(auVar47._12_4_ == iVar88);
        auVar20._4_4_ = iVar102;
        auVar20._0_4_ = iVar102;
        auVar20._8_4_ = iVar106;
        auVar20._12_4_ = iVar106;
        auVar103._4_4_ = auVar77._4_4_;
        auVar103._0_4_ = auVar77._4_4_;
        auVar103._8_4_ = auVar77._12_4_;
        auVar103._12_4_ = auVar77._12_4_;
        auVar47 = auVar20 & auVar92 | auVar103;
        auVar47 = packssdw(auVar47,auVar47);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar9,auVar47 ^ auVar9);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0xd0) = lVar40 + -0xd < lVar38;
        }
        auVar47 = pshufhw(auVar47,auVar92,0x84);
        auVar21._4_4_ = iVar102;
        auVar21._0_4_ = iVar102;
        auVar21._8_4_ = iVar106;
        auVar21._12_4_ = iVar106;
        auVar89 = pshufhw(auVar77,auVar21,0x84);
        auVar85 = pshufhw(auVar47,auVar103,0x84);
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar49 = (auVar85 | auVar89 & auVar47) ^ auVar49;
        auVar47 = packssdw(auVar49,auVar49);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._0_4_ >> 0x18 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x138) = lVar40 + -0xc < lVar38;
        }
        auVar47 = auVar74 ^ auVar62;
        auVar78._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar78._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar78._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar78._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar22._4_4_ = auVar78._0_4_;
        auVar22._0_4_ = auVar78._0_4_;
        auVar22._8_4_ = auVar78._8_4_;
        auVar22._12_4_ = auVar78._8_4_;
        auVar89 = pshuflw(auVar103,auVar22,0xe8);
        auVar50._0_4_ = -(uint)(auVar47._0_4_ == iVar57);
        auVar50._4_4_ = -(uint)(auVar47._4_4_ == iVar59);
        auVar50._8_4_ = -(uint)(auVar47._8_4_ == iVar87);
        auVar50._12_4_ = -(uint)(auVar47._12_4_ == iVar88);
        auVar93._4_4_ = auVar50._4_4_;
        auVar93._0_4_ = auVar50._4_4_;
        auVar93._8_4_ = auVar50._12_4_;
        auVar93._12_4_ = auVar50._12_4_;
        auVar47 = pshuflw(auVar50,auVar93,0xe8);
        auVar94._4_4_ = auVar78._4_4_;
        auVar94._0_4_ = auVar78._4_4_;
        auVar94._8_4_ = auVar78._12_4_;
        auVar94._12_4_ = auVar78._12_4_;
        auVar85 = pshuflw(auVar78,auVar94,0xe8);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 & auVar89,(auVar85 | auVar47 & auVar89) ^ auVar10);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x1a0) = lVar40 + -0xb < lVar38;
        }
        auVar23._4_4_ = auVar78._0_4_;
        auVar23._0_4_ = auVar78._0_4_;
        auVar23._8_4_ = auVar78._8_4_;
        auVar23._12_4_ = auVar78._8_4_;
        auVar94 = auVar93 & auVar23 | auVar94;
        auVar85 = packssdw(auVar94,auVar94);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47,auVar85 ^ auVar11);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._4_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x208) = lVar40 + -10 < lVar38;
        }
        auVar47 = auVar73 ^ auVar62;
        auVar79._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar79._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar79._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar79._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar95._4_4_ = auVar79._0_4_;
        auVar95._0_4_ = auVar79._0_4_;
        auVar95._8_4_ = auVar79._8_4_;
        auVar95._12_4_ = auVar79._8_4_;
        iVar102 = -(uint)(auVar47._4_4_ == iVar59);
        iVar106 = -(uint)(auVar47._12_4_ == iVar88);
        auVar24._4_4_ = iVar102;
        auVar24._0_4_ = iVar102;
        auVar24._8_4_ = iVar106;
        auVar24._12_4_ = iVar106;
        auVar104._4_4_ = auVar79._4_4_;
        auVar104._0_4_ = auVar79._4_4_;
        auVar104._8_4_ = auVar79._12_4_;
        auVar104._12_4_ = auVar79._12_4_;
        auVar47 = auVar24 & auVar95 | auVar104;
        auVar47 = packssdw(auVar47,auVar47);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar12,auVar47 ^ auVar12);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x270) = lVar40 + -9 < lVar38;
        }
        auVar47 = pshufhw(auVar47,auVar95,0x84);
        auVar25._4_4_ = iVar102;
        auVar25._0_4_ = iVar102;
        auVar25._8_4_ = iVar106;
        auVar25._12_4_ = iVar106;
        auVar89 = pshufhw(auVar79,auVar25,0x84);
        auVar85 = pshufhw(auVar47,auVar104,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar85 | auVar89 & auVar47) ^ auVar51;
        auVar47 = packssdw(auVar51,auVar51);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._6_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x2d8) = lVar40 + -8 < lVar38;
        }
        auVar47 = auVar72 ^ auVar62;
        auVar80._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar80._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar80._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar80._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar26._4_4_ = auVar80._0_4_;
        auVar26._0_4_ = auVar80._0_4_;
        auVar26._8_4_ = auVar80._8_4_;
        auVar26._12_4_ = auVar80._8_4_;
        auVar89 = pshuflw(auVar104,auVar26,0xe8);
        auVar52._0_4_ = -(uint)(auVar47._0_4_ == iVar57);
        auVar52._4_4_ = -(uint)(auVar47._4_4_ == iVar59);
        auVar52._8_4_ = -(uint)(auVar47._8_4_ == iVar87);
        auVar52._12_4_ = -(uint)(auVar47._12_4_ == iVar88);
        auVar96._4_4_ = auVar52._4_4_;
        auVar96._0_4_ = auVar52._4_4_;
        auVar96._8_4_ = auVar52._12_4_;
        auVar96._12_4_ = auVar52._12_4_;
        auVar47 = pshuflw(auVar52,auVar96,0xe8);
        auVar97._4_4_ = auVar80._4_4_;
        auVar97._0_4_ = auVar80._4_4_;
        auVar97._8_4_ = auVar80._12_4_;
        auVar97._12_4_ = auVar80._12_4_;
        auVar85 = pshuflw(auVar80,auVar97,0xe8);
        auVar81._8_4_ = 0xffffffff;
        auVar81._0_8_ = 0xffffffffffffffff;
        auVar81._12_4_ = 0xffffffff;
        auVar81 = (auVar85 | auVar47 & auVar89) ^ auVar81;
        auVar85 = packssdw(auVar81,auVar81);
        auVar47 = packsswb(auVar47 & auVar89,auVar85);
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x340) = lVar40 + -7 < lVar38;
        }
        auVar27._4_4_ = auVar80._0_4_;
        auVar27._0_4_ = auVar80._0_4_;
        auVar27._8_4_ = auVar80._8_4_;
        auVar27._12_4_ = auVar80._8_4_;
        auVar97 = auVar96 & auVar27 | auVar97;
        auVar85 = packssdw(auVar97,auVar97);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar85 = packssdw(auVar85 ^ auVar13,auVar85 ^ auVar13);
        auVar47 = packsswb(auVar47,auVar85);
        if ((auVar47._8_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x3a8) = lVar40 + -6 < lVar38;
        }
        auVar47 = auVar71 ^ auVar62;
        auVar82._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar82._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar82._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar82._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar98._4_4_ = auVar82._0_4_;
        auVar98._0_4_ = auVar82._0_4_;
        auVar98._8_4_ = auVar82._8_4_;
        auVar98._12_4_ = auVar82._8_4_;
        iVar102 = -(uint)(auVar47._4_4_ == iVar59);
        iVar106 = -(uint)(auVar47._12_4_ == iVar88);
        auVar28._4_4_ = iVar102;
        auVar28._0_4_ = iVar102;
        auVar28._8_4_ = iVar106;
        auVar28._12_4_ = iVar106;
        auVar105._4_4_ = auVar82._4_4_;
        auVar105._0_4_ = auVar82._4_4_;
        auVar105._8_4_ = auVar82._12_4_;
        auVar105._12_4_ = auVar82._12_4_;
        auVar47 = auVar28 & auVar98 | auVar105;
        auVar47 = packssdw(auVar47,auVar47);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar14,auVar47 ^ auVar14);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x410) = lVar40 + -5 < lVar38;
        }
        auVar47 = pshufhw(auVar47,auVar98,0x84);
        auVar29._4_4_ = iVar102;
        auVar29._0_4_ = iVar102;
        auVar29._8_4_ = iVar106;
        auVar29._12_4_ = iVar106;
        auVar89 = pshufhw(auVar82,auVar29,0x84);
        auVar85 = pshufhw(auVar47,auVar105,0x84);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar85 | auVar89 & auVar47) ^ auVar53;
        auVar47 = packssdw(auVar53,auVar53);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._10_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x478) = lVar40 + -4 < lVar38;
        }
        auVar47 = auVar68 ^ auVar62;
        auVar83._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar83._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar83._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar83._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar30._4_4_ = auVar83._0_4_;
        auVar30._0_4_ = auVar83._0_4_;
        auVar30._8_4_ = auVar83._8_4_;
        auVar30._12_4_ = auVar83._8_4_;
        auVar89 = pshuflw(auVar105,auVar30,0xe8);
        auVar54._0_4_ = -(uint)(auVar47._0_4_ == iVar57);
        auVar54._4_4_ = -(uint)(auVar47._4_4_ == iVar59);
        auVar54._8_4_ = -(uint)(auVar47._8_4_ == iVar87);
        auVar54._12_4_ = -(uint)(auVar47._12_4_ == iVar88);
        auVar99._4_4_ = auVar54._4_4_;
        auVar99._0_4_ = auVar54._4_4_;
        auVar99._8_4_ = auVar54._12_4_;
        auVar99._12_4_ = auVar54._12_4_;
        auVar47 = pshuflw(auVar54,auVar99,0xe8);
        auVar100._4_4_ = auVar83._4_4_;
        auVar100._0_4_ = auVar83._4_4_;
        auVar100._8_4_ = auVar83._12_4_;
        auVar100._12_4_ = auVar83._12_4_;
        auVar85 = pshuflw(auVar83,auVar100,0xe8);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 & auVar89,(auVar85 | auVar47 & auVar89) ^ auVar15);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x4e0) = lVar40 + -3 < lVar38;
        }
        auVar31._4_4_ = auVar83._0_4_;
        auVar31._0_4_ = auVar83._0_4_;
        auVar31._8_4_ = auVar83._8_4_;
        auVar31._12_4_ = auVar83._8_4_;
        auVar100 = auVar99 & auVar31 | auVar100;
        auVar85 = packssdw(auVar100,auVar100);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47,auVar85 ^ auVar16);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._12_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x548) = lVar40 + -2 < lVar38;
        }
        auVar47 = auVar64 ^ auVar62;
        auVar84._0_4_ = -(uint)(iVar57 < auVar47._0_4_);
        auVar84._4_4_ = -(uint)(iVar59 < auVar47._4_4_);
        auVar84._8_4_ = -(uint)(iVar87 < auVar47._8_4_);
        auVar84._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
        auVar101._4_4_ = auVar84._0_4_;
        auVar101._0_4_ = auVar84._0_4_;
        auVar101._8_4_ = auVar84._8_4_;
        auVar101._12_4_ = auVar84._8_4_;
        iVar57 = -(uint)(auVar47._4_4_ == iVar59);
        iVar59 = -(uint)(auVar47._12_4_ == iVar88);
        auVar86._4_4_ = iVar57;
        auVar86._0_4_ = iVar57;
        auVar86._8_4_ = iVar59;
        auVar86._12_4_ = iVar59;
        auVar55._4_4_ = auVar84._4_4_;
        auVar55._0_4_ = auVar84._4_4_;
        auVar55._8_4_ = auVar84._12_4_;
        auVar55._12_4_ = auVar84._12_4_;
        auVar55 = auVar86 & auVar101 | auVar55;
        auVar47 = packssdw(auVar55,auVar55);
        auVar17._8_4_ = 0xffffffff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar17,auVar47 ^ auVar17);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar37 + 0x5b0) = lVar40 + -1 < lVar38;
        }
        auVar47 = pshufhw(auVar47,auVar101,0x84);
        auVar85 = pshufhw(auVar84,auVar86,0x84);
        in_XMM11 = auVar85 & auVar47;
        auVar32._4_4_ = auVar84._4_4_;
        auVar32._0_4_ = auVar84._4_4_;
        auVar32._8_4_ = auVar84._12_4_;
        auVar32._12_4_ = auVar84._12_4_;
        auVar47 = pshufhw(auVar47,auVar32,0x84);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar47 | in_XMM11) ^ auVar56;
        auVar47 = packssdw(auVar56,auVar56);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._14_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar37 + 0x618) = lVar40 < lVar38;
        }
        lVar46 = (long)DAT_001852a0;
        lVar66 = auVar76._8_8_;
        auVar76._0_8_ = auVar76._0_8_ + lVar46;
        lVar58 = DAT_001852a0._8_8_;
        auVar76._8_8_ = lVar66 + lVar58;
        lVar66 = auVar75._8_8_;
        auVar75._0_8_ = auVar75._0_8_ + lVar46;
        auVar75._8_8_ = lVar66 + lVar58;
        lVar66 = auVar74._8_8_;
        auVar74._0_8_ = auVar74._0_8_ + lVar46;
        auVar74._8_8_ = lVar66 + lVar58;
        lVar66 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + lVar46;
        auVar73._8_8_ = lVar66 + lVar58;
        lVar66 = auVar72._8_8_;
        auVar72._0_8_ = auVar72._0_8_ + lVar46;
        auVar72._8_8_ = lVar66 + lVar58;
        lVar66 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar46;
        auVar71._8_8_ = lVar66 + lVar58;
        lVar66 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + lVar46;
        auVar68._8_8_ = lVar66 + lVar58;
        lVar66 = auVar64._8_8_;
        auVar64._0_8_ = auVar64._0_8_ + lVar46;
        auVar64._8_8_ = lVar66 + lVar58;
        pIVar37 = pIVar37 + 0x680;
        lVar46 = lVar40 - (ulong)(iVar43 + 0xfU & 0xfffffff0);
        lVar40 = lVar40 + 0x10;
        auVar47 = _DAT_001852a0;
      } while (lVar46 != -1);
    }
  }
  if (iVar39 == iVar41) {
    table->IsUnfrozenRows = true;
    fVar60 = table->RowPosY2;
    fVar65 = (pIVar5->InnerClipRect).Min.y;
    fVar70 = (pIVar5->InnerClipRect).Max.y;
    uVar44 = -(uint)(fVar65 <= fVar60 + 1.0);
    fVar65 = (float)(~uVar44 & (uint)fVar65 | (uint)(fVar60 + 1.0) & uVar44);
    if (fVar70 <= fVar65) {
      fVar65 = fVar70;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar65;
    (table->BgClipRect).Min.y = fVar65;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar70;
    (table->BgClipRect).Max.y = fVar70;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar70 = table->RowPosY1;
    fVar61 = (fVar60 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar5->DC).CursorPos.y = fVar61;
    table->RowPosY2 = fVar61;
    table->RowPosY1 = fVar61 - (fVar60 - fVar70);
    iVar43 = table->ColumnsCount;
    if (0 < (long)iVar43) {
      pIVar7 = (table->Columns).Data;
      lVar38 = 0;
      do {
        (&pIVar7->DrawChannelCurrent)[lVar38] = (&pIVar7->DrawChannelUnfrozen)[lVar38];
        *(float *)((long)&(pIVar7->ClipRect).Min.y + lVar38) = fVar65;
        lVar38 = lVar38 + 0x68;
      } while ((long)iVar43 * 0x68 - lVar38 != 0);
    }
    pIVar7 = (table->Columns).Data;
    IVar3 = (pIVar7->ClipRect).Max;
    IVar33 = (pIVar7->ClipRect).Min;
    IVar34 = (pIVar7->ClipRect).Max;
    (pIVar5->ClipRect).Min = (pIVar7->ClipRect).Min;
    (pIVar5->ClipRect).Max = IVar3;
    pIVar6 = pIVar5->DrawList;
    (pIVar6->_CmdHeader).ClipRect.x = IVar33.x;
    (pIVar6->_CmdHeader).ClipRect.y = IVar33.y;
    (pIVar6->_CmdHeader).ClipRect.z = IVar34.x;
    (pIVar6->_CmdHeader).ClipRect.w = IVar34.y;
    pIVar2 = (pIVar5->DrawList->_ClipRectStack).Data +
             (long)(pIVar5->DrawList->_ClipRectStack).Size + -1;
    pIVar2->x = IVar33.x;
    pIVar2->y = IVar33.y;
    pIVar2->z = IVar34.x;
    pIVar2->w = IVar34.y;
    ImDrawListSplitter::SetCurrentChannel
              (table->DrawSplitter,pIVar5->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}